

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astReturnNode_primitiveCompileIntoBytecode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t value;
  sysbvm_tuple_t result;
  sysbvm_astReturnNode_t **returnNode;
  sysbvm_functionBytecodeDirectCompiler_t **compiler;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  value = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                    (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
                     *(sysbvm_tuple_t *)(*arguments + 0x28));
  sysbvm_functionBytecodeAssembler_return
            (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),value);
  return value;
}

Assistant:

static sysbvm_tuple_t sysbvm_astReturnNode_primitiveCompileIntoBytecode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_functionBytecodeDirectCompiler_t **compiler = (sysbvm_functionBytecodeDirectCompiler_t **)&arguments[1];

    sysbvm_astReturnNode_t **returnNode = (sysbvm_astReturnNode_t**)node;
    sysbvm_tuple_t result = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*returnNode)->expression);
    sysbvm_functionBytecodeAssembler_return(context, (*compiler)->assembler, result);
    return result;
}